

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  TextGenerator *this_00;
  uint uVar1;
  second_type *ppFVar2;
  int i;
  string local_90;
  FieldValuePrinter *local_70;
  second_type local_68;
  FieldValuePrinter *printer;
  string local_50;
  TextGenerator *local_30;
  TextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  local_30 = generator;
  generator_local = (TextGenerator *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  if ((this->use_field_number_ & 1U) == 0) {
    local_70 = internal::scoped_ptr<const_google::protobuf::TextFormat::FieldValuePrinter>::get
                         (&this->default_field_value_printer_);
    ppFVar2 = FindWithDefault<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
                        (&this->custom_printers_,(first_type *)&generator_local,&local_70);
    this_00 = local_30;
    local_68 = *ppFVar2;
    (*local_68->_vptr_FieldValuePrinter[0xc])
              (&local_90,local_68,reflection_local,field_local,generator_local);
    TextGenerator::Print(this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    uVar1 = FieldDescriptor::number(field);
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)uVar1,i);
    TextGenerator::Print(generator,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator& generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator.Print(SimpleItoa(field->number()));
    return;
  }

  const FieldValuePrinter* printer = FindWithDefault(
      custom_printers_, field, default_field_value_printer_.get());
  generator.Print(printer->PrintFieldName(message, reflection, field));
}